

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O2

void __thiscall wasm::RandomLattice::RandomLattice(RandomLattice *this,Random *rand,size_t depth)

{
  undefined1 __p [8];
  undefined8 __p_00;
  Random *pRVar1;
  uint32_t uVar2;
  unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
  *this_00;
  undefined1 local_a8 [8];
  undefined1 local_a0 [40];
  _Variadic_union<wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
  local_78;
  undefined1 local_50;
  RandomLattice local_48;
  RandomLattice local_38;
  
  this->rand = rand;
  (this->lattice)._M_t.
  super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
  .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl =
       (LatticeImpl *)0x0;
  this_00 = &this->lattice;
  uVar2 = Random::upTo(rand,0xd);
  if (uVar2 < 7) {
    RandomFullLattice::RandomFullLattice
              ((RandomFullLattice *)local_a0,rand,depth,
               (optional<unsigned_int>)((ulong)uVar2 | 0x100000000));
    local_78._0_8_ = local_a0._0_8_;
    local_78._8_8_ = local_a0._8_8_;
    local_a0._8_8_ =
         (__uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
          )0x0;
    local_50 = 0;
    std::make_unique<wasm::RandomLattice::LatticeImpl,wasm::RandomLattice::LatticeImpl>
              ((LatticeImpl *)&local_38);
    pRVar1 = local_38.rand;
    local_38.rand = (Random *)0x0;
    std::
    __uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::reset((__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
             *)this_00,(pointer)pRVar1);
    std::
    unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::~unique_ptr((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                   *)&local_38);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                         *)&local_78._M_first);
    std::
    unique_ptr<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
    ::~unique_ptr((unique_ptr<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
                   *)(local_a0 + 8));
    return;
  }
  switch(uVar2) {
  case 7:
    local_50 = 1;
    std::make_unique<wasm::RandomLattice::LatticeImpl,wasm::RandomLattice::LatticeImpl>
              ((LatticeImpl *)local_a0);
    __p_00 = local_a0._0_8_;
    local_a0._0_8_ = (Random *)0x0;
    std::
    __uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::reset((__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
             *)this_00,(pointer)__p_00);
    std::
    unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::~unique_ptr((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                   *)local_a0);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                         *)&local_78._M_first);
    return;
  case 8:
    RandomLattice(&local_38,rand,depth + 1);
    local_78._8_8_ =
         local_38.lattice._M_t.
         super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
         .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl;
    local_38.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
            )0x0;
    local_a0._0_8_ = local_38.rand;
    local_78._0_8_ = local_38.rand;
    local_a0._8_8_ = (LatticeImpl *)0x0;
    local_50 = 2;
    std::make_unique<wasm::RandomLattice::LatticeImpl,wasm::RandomLattice::LatticeImpl>
              ((LatticeImpl *)&local_48);
    goto LAB_001a3dec;
  case 9:
    RandomLattice(&local_38,rand,depth + 1);
    local_78._8_8_ =
         local_38.lattice._M_t.
         super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
         .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl;
    local_38.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
            )0x0;
    local_a0._0_8_ = local_38.rand;
    local_78._0_8_ = local_38.rand;
    local_a0._8_8_ =
         (__uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
          )0x0;
    local_50 = 3;
    std::make_unique<wasm::RandomLattice::LatticeImpl,wasm::RandomLattice::LatticeImpl>
              ((LatticeImpl *)&local_48);
LAB_001a3dec:
    pRVar1 = local_48.rand;
    local_48.rand = (Random *)0x0;
    std::
    __uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::reset((__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
             *)this_00,(pointer)pRVar1);
    std::
    unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::~unique_ptr((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                   *)&local_48);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                         *)&local_78._M_first);
    std::
    unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::~unique_ptr((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                   *)(local_a0 + 8));
    break;
  case 10:
    RandomLattice(&local_38,rand,depth + 1);
    uVar2 = Random::upTo(rand,4);
    local_78._8_8_ =
         local_38.lattice._M_t.
         super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
         .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl;
    local_a0._16_8_ = ZEXT48(uVar2);
    local_a0._0_8_ = local_38.rand;
    local_38.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
            )0x0;
    local_a0._8_8_ =
         (__uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
          )0x0;
    local_78._0_8_ = local_38.rand;
    local_50 = 4;
    local_78._16_8_ = local_a0._16_8_;
    std::make_unique<wasm::RandomLattice::LatticeImpl,wasm::RandomLattice::LatticeImpl>
              ((LatticeImpl *)&local_48);
    pRVar1 = local_48.rand;
    local_48.rand = (Random *)0x0;
    std::
    __uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::reset((__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
             *)this_00,(pointer)pRVar1);
    std::
    unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::~unique_ptr((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                   *)&local_48);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                         *)&local_78._M_first);
    std::
    unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::~unique_ptr((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                   *)(local_a0 + 8));
    break;
  case 0xb:
    RandomLattice(&local_38,rand,depth + 1);
    RandomLattice(&local_48,rand,depth + 1);
    std::tuple<wasm::RandomLattice,_wasm::RandomLattice>::
    tuple<wasm::RandomLattice,_wasm::RandomLattice,_true>
              ((tuple<wasm::RandomLattice,_wasm::RandomLattice> *)local_a0,&local_38,&local_48);
    std::
    variant<wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
    ::
    variant<wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,void,void,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,void>
              ((variant<wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
                *)&local_78._M_first,(Tuple<wasm::RandomLattice,_wasm::RandomLattice> *)local_a0);
    std::make_unique<wasm::RandomLattice::LatticeImpl,wasm::RandomLattice::LatticeImpl>
              ((LatticeImpl *)local_a8);
    __p = local_a8;
    local_a8 = (undefined1  [8])0x0;
    std::
    __uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::reset((__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
             *)this_00,(pointer)__p);
    std::
    unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::~unique_ptr((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                   *)local_a8);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                         *)&local_78._M_first);
    std::_Tuple_impl<0UL,_wasm::RandomLattice,_wasm::RandomLattice>::~_Tuple_impl
              ((_Tuple_impl<0UL,_wasm::RandomLattice,_wasm::RandomLattice> *)local_a0);
    std::
    unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::~unique_ptr(&local_48.lattice);
    break;
  case 0xc:
    RandomLattice(&local_38,rand,depth + 1);
    analysis::SharedPath<wasm::RandomLattice>::SharedPath
              ((SharedPath<wasm::RandomLattice> *)local_a0,&local_38);
    std::
    variant<wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
    ::
    variant<wasm::analysis::SharedPath<wasm::RandomLattice>,void,void,wasm::analysis::SharedPath<wasm::RandomLattice>,void>
              ((variant<wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
                *)&local_78._M_first,(SharedPath<wasm::RandomLattice> *)local_a0);
    std::make_unique<wasm::RandomLattice::LatticeImpl,wasm::RandomLattice::LatticeImpl>
              ((LatticeImpl *)&local_48);
    pRVar1 = local_48.rand;
    local_48.rand = (Random *)0x0;
    std::
    __uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::reset((__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
             *)this_00,(pointer)pRVar1);
    std::
    unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::~unique_ptr((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                   *)&local_48);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                         *)&local_78._M_first);
    analysis::SharedPath<wasm::RandomLattice>::~SharedPath
              ((SharedPath<wasm::RandomLattice> *)local_a0);
    break;
  default:
    wasm::handle_unreachable
              ("unexpected pick",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp"
               ,0x115);
  }
  std::
  unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
  ::~unique_ptr(&local_38.lattice);
  return;
}

Assistant:

RandomLattice::RandomLattice(Random& rand, size_t depth) : rand(rand) {
  // TODO: Limit the depth once we get lattices with more fan-out.
  uint32_t pick = rand.upTo(FullLatticePicks + 6);

  if (pick < FullLatticePicks) {
    lattice = std::make_unique<LatticeImpl>(
      LatticeImpl{RandomFullLattice{rand, depth, pick}});
    return;
  }

  switch (pick) {
    case FullLatticePicks + 0:
      lattice = std::make_unique<LatticeImpl>(LatticeImpl{Flat<uint32_t>{}});
      return;
    case FullLatticePicks + 1:
      lattice = std::make_unique<LatticeImpl>(
        LatticeImpl{Lift{RandomLattice{rand, depth + 1}}});
      return;
    case FullLatticePicks + 2:
      lattice = std::make_unique<LatticeImpl>(
        LatticeImpl{ArrayLattice{RandomLattice{rand, depth + 1}}});
      return;
    case FullLatticePicks + 3:
      lattice = std::make_unique<LatticeImpl>(
        LatticeImpl{Vector{RandomLattice{rand, depth + 1}, rand.upTo(4)}});
      return;
    case FullLatticePicks + 4:
      lattice = std::make_unique<LatticeImpl>(LatticeImpl{TupleLattice{
        RandomLattice{rand, depth + 1}, RandomLattice{rand, depth + 1}}});
      return;
    case FullLatticePicks + 5:
      lattice = std::make_unique<LatticeImpl>(
        LatticeImpl{SharedPath{RandomLattice{rand, depth + 1}}});
      return;
  }
  WASM_UNREACHABLE("unexpected pick");
}